

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbyte.hpp
# Opt level: O3

void vbyte_encode_u32(uint8_t **out,uint32_t x)

{
  byte bVar1;
  byte *pbVar2;
  
  if (0x7f < x) {
    bVar1 = (byte)x | 0x80;
    if (x < 0x4000) {
      pbVar2 = *out;
      x = x >> 7;
      *out = pbVar2 + 1;
      *pbVar2 = bVar1;
    }
    else {
      if (x < 0x200000) {
        pbVar2 = *out;
        *out = pbVar2 + 1;
        *pbVar2 = bVar1;
        bVar1 = (byte)(x >> 7);
        x = x >> 0xe;
        pbVar2 = *out;
      }
      else {
        pbVar2 = *out;
        *out = pbVar2 + 1;
        *pbVar2 = bVar1;
        pbVar2 = *out;
        *out = pbVar2 + 1;
        *pbVar2 = (byte)(x >> 7) | 0x80;
        bVar1 = (byte)(x >> 0x15);
        pbVar2 = *out;
        *out = pbVar2 + 1;
        *pbVar2 = (byte)(x >> 0xe) | 0x80;
        if (x < 0x10000000) goto LAB_0012092c;
        pbVar2 = *out;
        x = x >> 0x1c;
      }
      *out = pbVar2 + 1;
      *pbVar2 = bVar1 | 0x80;
    }
  }
  bVar1 = (byte)x;
LAB_0012092c:
  pbVar2 = *out;
  *out = pbVar2 + 1;
  *pbVar2 = bVar1;
  return;
}

Assistant:

void vbyte_encode_u32(uint8_t*& out, uint32_t x)
{
    if (x < (1U << 7)) {
        *out++ = static_cast<uint8_t>(x & 127);
    } else if (x < (1U << 14)) {
        *out++ = extract7bits<0>(x) | 128;
        *out++ = extract7bitsmaskless<1>(x) & 127;
    } else if (x < (1U << 21)) {
        *out++ = extract7bits<0>(x) | 128;
        *out++ = extract7bits<1>(x) | 128;
        *out++ = extract7bitsmaskless<2>(x) & 127;
    } else if (x < (1U << 28)) {
        *out++ = extract7bits<0>(x) | 128;
        *out++ = extract7bits<1>(x) | 128;
        *out++ = extract7bits<2>(x) | 128;
        *out++ = extract7bitsmaskless<3>(x) & 127;
    } else {
        *out++ = extract7bits<0>(x) | 128;
        *out++ = extract7bits<1>(x) | 128;
        *out++ = extract7bits<2>(x) | 128;
        *out++ = extract7bits<3>(x) | 128;
        *out++ = extract7bitsmaskless<4>(x) & 127;
    }
}